

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O1

void __thiscall
imrt::Collimator::initializeCoordinates
          (Collimator *this,
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *coord_files)

{
  size_t *psVar1;
  iterator __position;
  _Base_ptr p_Var2;
  pointer pdVar3;
  iterator iVar4;
  pointer ppVar5;
  pointer ppVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  pointer ppVar10;
  _List_node_base *p_Var11;
  istream *piVar12;
  vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *this_00;
  _Rb_tree_header *p_Var13;
  mapped_type *pmVar14;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var15;
  mapped_type *pmVar16;
  vector<double,std::allocator<double>> *pvVar17;
  mapped_type *pmVar18;
  mapped_type *pmVar19;
  runtime_error *this_01;
  int iVar20;
  _Rb_tree_header *p_Var21;
  ulong uVar22;
  int j;
  ulong uVar23;
  long lVar24;
  bool bVar25;
  double y;
  int angle;
  double x;
  string linec;
  string line;
  stringstream ss;
  ifstream myfile;
  double local_458;
  int local_44c;
  double local_448;
  _Rb_tree_header *local_440;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_438;
  map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
  *local_430;
  char *local_428;
  undefined8 local_420;
  char local_418 [16];
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *local_408;
  list<int,_std::allocator<int>_> *local_400;
  ulong local_3f8;
  pair<double,_double> local_3f0;
  undefined1 *local_3e0;
  undefined8 local_3d8;
  undefined1 local_3d0 [16];
  long local_3c0 [3];
  string local_3a8 [104];
  ios_base local_340 [264];
  long local_238 [65];
  
  std::ifstream::ifstream(local_238);
  local_3e0 = local_3d0;
  local_3d8 = 0;
  local_3d0[0] = 0;
  local_428 = local_418;
  local_420 = 0;
  local_418[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)local_3c0);
  ppVar10 = (coord_files->
            super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((coord_files->
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppVar10) {
    local_400 = &this->angles;
    local_430 = &this->angle_coord;
    local_440 = &(this->beam_coord)._M_t._M_impl.super__Rb_tree_header;
    local_408 = &this->nb_angle_beamlets;
    uVar23 = 0;
    local_438 = coord_files;
    do {
      local_44c = ppVar10[uVar23].first;
      local_3f8 = uVar23;
      p_Var11 = (_List_node_base *)operator_new(0x18);
      *(int *)&p_Var11[1]._M_next = local_44c;
      std::__detail::_List_node_base::_M_hook(p_Var11);
      psVar1 = &(this->angles).super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      std::ifstream::open((string *)local_238,
                          (int)(local_438->
                               super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + (int)uVar23 * 0x28 +
                          _S_in);
      cVar8 = std::__basic_file<char>::is_open();
      if (cVar8 == '\0') {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"error reading file.");
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      while( true ) {
        cVar8 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                (char)(istream *)local_238);
        piVar12 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)local_238,(string *)&local_3e0,cVar8);
        if (((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) != 0) break;
        std::ios::clear((int)*(undefined8 *)(local_3c0[0] + -0x18) + (int)local_3c0);
        std::__cxx11::stringbuf::str(local_3a8);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_3c0,(string *)&local_428,'\t');
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_3c0,(string *)&local_428,'\t');
        local_448 = atof(local_428);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_3c0,(string *)&local_428,'\t');
        local_458 = atof(local_428);
        this_00 = (vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                  std::
                  map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
                  ::operator[](local_430,&local_44c);
        local_3f0.first = local_448;
        local_3f0.second = local_458;
        __position._M_current = *(pair<double,_double> **)(this_00 + 8);
        if (__position._M_current == *(pair<double,_double> **)(this_00 + 0x10)) {
          std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
          _M_realloc_insert<std::pair<double,double>>(this_00,__position,&local_3f0);
        }
        else {
          (__position._M_current)->first = local_448;
          (__position._M_current)->second = local_458;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
        }
        p_Var13 = local_440;
        for (p_Var2 = (this->beam_coord)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
            p_Var2 = (&p_Var2->_M_left)[bVar7 && bVar25]) {
          bVar25 = local_448 != *(double *)(p_Var2 + 1);
          bVar7 = *(double *)(p_Var2 + 1) <= local_448;
          if (!bVar7 || !bVar25) {
            p_Var13 = (_Rb_tree_header *)p_Var2;
          }
        }
        p_Var21 = local_440;
        if ((p_Var13 != local_440) && ((double)p_Var13->_M_node_count <= local_448)) {
          p_Var21 = p_Var13;
        }
        if (p_Var21 == local_440) {
          pvVar17 = (vector<double,std::allocator<double>> *)
                    std::
                    map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                    ::operator[](&this->beam_coord,&local_448);
          iVar4._M_current = *(double **)(pvVar17 + 8);
          if (iVar4._M_current == *(double **)(pvVar17 + 0x10)) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      (pvVar17,iVar4,&local_458);
          }
          else {
            *iVar4._M_current = local_458;
            *(double **)(pvVar17 + 8) = iVar4._M_current + 1;
          }
          insertXorder(this,local_448);
        }
        else {
          pmVar14 = std::
                    map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                    ::operator[](&this->beam_coord,&local_448);
          pdVar3 = (pmVar14->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pmVar14 = std::
                    map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                    ::operator[](&this->beam_coord,&local_448);
          _Var15 = std::
                   __find_if<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_equals_val<double_const>>
                             (pdVar3,(pmVar14->super__Vector_base<double,_std::allocator<double>_>).
                                     _M_impl.super__Vector_impl_data._M_finish,&local_458);
          pmVar14 = std::
                    map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                    ::operator[](&this->beam_coord,&local_448);
          bVar25 = _Var15._M_current !=
                   (pmVar14->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          lVar24 = 0;
          uVar23 = 0;
          while ((pmVar14 = std::
                            map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                            ::operator[](&this->beam_coord,&local_448),
                 uVar23 < (ulong)((long)(pmVar14->
                                        super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                        .super__Vector_impl_data._M_finish -
                                  (long)(pmVar14->
                                        super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                        .super__Vector_impl_data._M_start >> 3) && (!bVar25))) {
            pmVar14 = std::
                      map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                      ::operator[](&this->beam_coord,&local_448);
            if (local_458 <
                (pmVar14->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar23]) {
              pmVar14 = std::
                        map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                        ::operator[](&this->beam_coord,&local_448);
              pmVar16 = std::
                        map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                        ::operator[](&this->beam_coord,&local_448);
              bVar25 = true;
              std::vector<double,_std::allocator<double>_>::insert
                        (pmVar14,(double *)
                                 ((long)(pmVar16->
                                        super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                        .super__Vector_impl_data._M_start + lVar24),&local_458);
            }
            uVar23 = uVar23 + 1;
            lVar24 = lVar24 + 8;
          }
          if (!bVar25) {
            pvVar17 = (vector<double,std::allocator<double>> *)
                      std::
                      map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                      ::operator[](&this->beam_coord,&local_448);
            iVar4._M_current = *(double **)(pvVar17 + 8);
            if (iVar4._M_current == *(double **)(pvVar17 + 0x10)) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        (pvVar17,iVar4,&local_458);
            }
            else {
              *iVar4._M_current = local_458;
              *(double **)(pvVar17 + 8) = iVar4._M_current + 1;
            }
          }
        }
        insertYorder(this,local_458);
      }
      std::ifstream::close();
      pmVar18 = std::
                map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
                ::operator[](local_430,&local_44c);
      ppVar5 = (pmVar18->
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      ppVar6 = (pmVar18->
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      pmVar19 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[](local_408,&local_44c);
      *pmVar19 = (mapped_type)((ulong)((long)ppVar6 - (long)ppVar5) >> 4);
      uVar23 = local_3f8 + 1;
      ppVar10 = (local_438->
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar22 = ((long)(local_438->
                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar10 >> 3) *
               -0x3333333333333333;
    } while (uVar23 <= uVar22 && uVar22 - uVar23 != 0);
  }
  pdVar3 = (this->ycoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar9 = (int)((ulong)((long)(this->xcoord).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->xcoord).super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3);
  this->xdim = iVar9;
  iVar20 = (int)((ulong)((long)pdVar3 -
                        (long)(this->ycoord).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3);
  this->ydim = iVar20;
  this->nb_beamlets = iVar20 * iVar9;
  setActiveBeamlets(this,&this->angle_coord);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
  std::ios_base::~ios_base(local_340);
  if (local_428 != local_418) {
    operator_delete(local_428);
  }
  if (local_3e0 != local_3d0) {
    operator_delete(local_3e0);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void Collimator::initializeCoordinates(vector < pair<int, string> >& coord_files) {
  ifstream myfile;
  string line, linec;
  stringstream ss;
  double x, y;
  bool flag;

  //nb_angles=coord_files.size();

  for (int i=0 ; i < coord_files.size(); i++) {
    // Open file
    int angle = coord_files[i].first;
    angles.push_back(angle);
    myfile.open(coord_files[i].second);
    if (!myfile.is_open())
      throw runtime_error("error reading file.");

    // Read lines of the file
    while (getline (myfile,line)) {
      flag=false;
      ss.clear(); ss.str(line);
      getline (ss,linec,'\t'); //the first number is discarded (beamlet id)
      getline (ss,linec,'\t');
      x = atof(linec.c_str());
      getline (ss,linec,'\t');
      y = atof(linec.c_str());


      angle_coord[angle].push_back(make_pair(x,y));

      if (beam_coord.find(x) == beam_coord.end()) {
        // New x coordinate
        beam_coord[x].push_back(y);
        insertXorder(x);
        insertYorder(y);
      } else {
        if (find(beam_coord[x].begin(), beam_coord[x].end(), y) != beam_coord[x].end())
          flag=true;
        // New y coordinate: insert in order
        for (int j=0; j < beam_coord[x].size() && !flag; j++) {
          if (beam_coord[x][j] > y) {
            beam_coord[x].insert(beam_coord[x].begin()+j, y);
            flag=true;
          }
        }
        if (!flag) beam_coord[x].push_back(y);
        insertYorder(y);
      }
    }
    myfile.close();
    nb_angle_beamlets[angle]=(angle_coord[angle].size());
  }
  xdim = xcoord.size();
  ydim = ycoord.size();
  nb_beamlets= xdim*ydim;
  //printCoordinates();

  setActiveBeamlets(angle_coord);
  //printActiveBeam();
}